

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O3

void __thiscall FuncInfo::OnEndVisitFunction(FuncInfo *this,ParseNodeFnc *pnodeFnc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FuncInfo *pFVar4;
  
  if ((pnodeFnc->super_ParseNode).nop != knopFncDecl) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/FuncInfo.cpp"
                       ,0x1ae,"(pnodeFnc->nop == knopFncDecl)","pnodeFnc->nop == knopFncDecl");
    if (!bVar2) goto LAB_0089f460;
    *puVar3 = 0;
  }
  pFVar4 = pnodeFnc->funcInfo;
  if (this->currentChildFunction != pFVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/FuncInfo.cpp"
                       ,0x1af,"(this->GetCurrentChildFunction() == pnodeFnc->funcInfo)",
                       "this->GetCurrentChildFunction() == pnodeFnc->funcInfo");
    if (!bVar2) {
LAB_0089f460:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pFVar4 = pnodeFnc->funcInfo;
  }
  pFVar4->currentChildScope = (Scope *)0x0;
  this->currentChildFunction = (FuncInfo *)0x0;
  return;
}

Assistant:

void FuncInfo::OnEndVisitFunction(ParseNodeFnc *pnodeFnc)
{
    Assert(pnodeFnc->nop == knopFncDecl);
    Assert(this->GetCurrentChildFunction() == pnodeFnc->funcInfo);

    pnodeFnc->funcInfo->SetCurrentChildScope(nullptr);
    this->SetCurrentChildFunction(nullptr);
}